

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O2

BSTNode * __thiscall search::BSTNode::successor(BSTNode *this)

{
  BSTNode *pBVar1;
  
  pBVar1 = min(this->right_);
  return pBVar1;
}

Assistant:

BSTNode* BSTNode::successor()
    {
        if (right_)
            return right_->min();
        else
        {
            BSTNode* node = this;
            BSTNode* p = parent_;
            while (p && p->right_ == node)
            {
                node = p;
                p = node->parent_;
            }
        }
    }